

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

double __thiscall icu_63::MessagePattern::getNumericValue(MessagePattern *this,Part *part)

{
  UMessagePatternPartType type;
  Part *part_local;
  MessagePattern *this_local;
  
  if (part->type == UMSGPAT_PART_TYPE_ARG_INT) {
    this_local = (MessagePattern *)(double)(int)part->value;
  }
  else if (part->type == UMSGPAT_PART_TYPE_ARG_DOUBLE) {
    this_local = (MessagePattern *)this->numericValues[part->value];
  }
  else {
    this_local = (MessagePattern *)0xc19d6f3454000000;
  }
  return (double)this_local;
}

Assistant:

double
MessagePattern::getNumericValue(const Part &part) const {
    UMessagePatternPartType type=part.type;
    if(type==UMSGPAT_PART_TYPE_ARG_INT) {
        return part.value;
    } else if(type==UMSGPAT_PART_TYPE_ARG_DOUBLE) {
        return numericValues[part.value];
    } else {
        return UMSGPAT_NO_NUMERIC_VALUE;
    }
}